

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaExist.c
# Opt level: O2

int Gia_ManQuantVerify_rec(Gia_Man_t *p,int iObj,int CiId)

{
  int iVar1;
  Gia_Obj_t *pObj;
  
  while( true ) {
    iVar1 = Gia_ObjIsTravIdCurrentId(p,iObj);
    if (iVar1 != 0) {
      return 0;
    }
    Gia_ObjSetTravIdCurrentId(p,iObj);
    pObj = Gia_ManObj(p,iObj);
    if ((~(uint)*(undefined8 *)pObj & 0x9fffffff) == 0) break;
    iVar1 = Gia_ManQuantVerify_rec(p,iObj - ((uint)*(undefined8 *)pObj & 0x1fffffff),CiId);
    if (iVar1 != 0) {
      return 1;
    }
    iObj = iObj - (*(uint *)&pObj->field_0x4 & 0x1fffffff);
  }
  iVar1 = Gia_ObjCioId(pObj);
  return (uint)(iVar1 == CiId);
}

Assistant:

int Gia_ManQuantVerify_rec( Gia_Man_t * p, int iObj, int CiId )
{
    Gia_Obj_t * pObj;
    if ( Gia_ObjIsTravIdCurrentId( p, iObj ) )
        return 0;
    Gia_ObjSetTravIdCurrentId( p, iObj );
    pObj = Gia_ManObj( p, iObj );
    if ( Gia_ObjIsCi(pObj) )
        return Gia_ObjCioId(pObj) == CiId;
    return Gia_ManQuantVerify_rec( p, Gia_ObjFaninId0(pObj, iObj), CiId ) ||
           Gia_ManQuantVerify_rec( p, Gia_ObjFaninId1(pObj, iObj), CiId );
}